

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__1>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_70098e60 comp)

{
  Int i;
  Int *pIVar1;
  bool bVar2;
  Int *pIVar3;
  Int *pIVar4;
  Int j;
  long lVar5;
  bool bVar6;
  anon_class_8_1_70098e60 local_50;
  Int *local_48;
  ulong local_40;
  Int *local_38;
  
  if (begin._M_current == end._M_current) {
LAB_0038f1e9:
    bVar6 = true;
  }
  else {
    local_40 = 0;
    local_50.values = comp.values;
    local_38 = begin._M_current;
    do {
      lVar5 = -(long)begin._M_current;
      pIVar3 = begin._M_current;
      do {
        begin._M_current = pIVar3 + 1;
        bVar6 = begin._M_current == end._M_current;
        if (bVar6) goto LAB_0038f1e9;
        j = *pIVar3;
        i = *begin._M_current;
        bVar2 = ipx::Sortperm::anon_class_8_1_70098e60::operator()(&local_50,i,j);
        lVar5 = lVar5 + -4;
        pIVar3 = begin._M_current;
        pIVar1 = end._M_current;
      } while (!bVar2);
      do {
        local_48 = pIVar1;
        pIVar1 = pIVar3 + -1;
        *pIVar3 = j;
        pIVar4 = local_38;
        if (pIVar1 == local_38) break;
        j = pIVar3[-2];
        bVar2 = ipx::Sortperm::anon_class_8_1_70098e60::operator()(&local_50,i,j);
        pIVar3 = pIVar1;
        pIVar4 = pIVar1;
        pIVar1 = local_48;
      } while (bVar2);
      *pIVar4 = i;
      local_40 = local_40 + (-(lVar5 + (long)pIVar4) >> 2);
      end._M_current = local_48;
    } while (local_40 < 9);
  }
  return bVar6;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }